

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

match_t * clipp::detail::longest_prefix_match<clipp::detail::select_all>
                    (match_t *__return_storage_ptr__,scoped_dfs_traverser *pos,arg_string *arg,
                    select_all *select)

{
  bool bVar1;
  pattern *ppVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  subrange sVar6;
  scoped_dfs_traverser local_358;
  arg_string local_2b8;
  match_t local_298;
  undefined4 local_1d4;
  scoped_dfs_traverser local_1d0;
  arg_string local_130;
  undefined1 local_100 [8];
  subrange match;
  parameter *param;
  match_t longest;
  select_all *select_local;
  arg_string *arg_local;
  scoped_dfs_traverser *pos_local;
  
  longest.pos_._152_8_ = select;
  match_t::match_t((match_t *)&param);
  do {
    bVar1 = scoped_dfs_traverser::operator_cast_to_bool(pos);
    if (!bVar1) {
      match_t::match_t(__return_storage_ptr__,(match_t *)&param);
LAB_0012198f:
      local_1d4 = 1;
      match_t::~match_t((match_t *)&param);
      return __return_storage_ptr__;
    }
    ppVar2 = scoped_dfs_traverser::operator->(pos);
    bVar1 = group::child_t<clipp::parameter,_clipp::group>::is_param(ppVar2);
    if (bVar1) {
      ppVar2 = scoped_dfs_traverser::operator->(pos);
      match.length_ = (size_type)group::child_t<clipp::parameter,_clipp::group>::as_param(ppVar2);
      bVar1 = select_all::operator()((select_all *)longest.pos_._152_8_,(parameter *)match.length_);
      if (bVar1) {
        sVar6 = parameter::match((parameter *)match.length_,arg);
        match.at_ = sVar6.length_;
        local_100 = (undefined1  [8])sVar6.at_;
        bVar1 = subrange::prefix((subrange *)local_100);
        if (bVar1) {
          sVar3 = subrange::length((subrange *)local_100);
          sVar4 = std::__cxx11::string::size();
          if (sVar3 == sVar4) {
            std::__cxx11::string::string((string *)&local_130,(string *)arg);
            scoped_dfs_traverser::scoped_dfs_traverser(&local_1d0,pos);
            match_t::match_t(__return_storage_ptr__,&local_130,&local_1d0);
            scoped_dfs_traverser::~scoped_dfs_traverser(&local_1d0);
            std::__cxx11::string::~string((string *)&local_130);
            goto LAB_0012198f;
          }
          sVar3 = subrange::length((subrange *)local_100);
          sVar5 = match_t::length((match_t *)&param);
          if (sVar5 < sVar3) {
            subrange::at((subrange *)local_100);
            subrange::length((subrange *)local_100);
            std::__cxx11::string::substr((ulong)&local_2b8,(ulong)arg);
            scoped_dfs_traverser::scoped_dfs_traverser(&local_358,pos);
            match_t::match_t(&local_298,&local_2b8,&local_358);
            match_t::operator=((match_t *)&param,&local_298);
            match_t::~match_t(&local_298);
            scoped_dfs_traverser::~scoped_dfs_traverser(&local_358);
            std::__cxx11::string::~string((string *)&local_2b8);
          }
        }
      }
    }
    scoped_dfs_traverser::operator++(pos);
  } while( true );
}

Assistant:

match_t
longest_prefix_match(scoped_dfs_traverser pos, const arg_string& arg,
                     const ParamSelector& select)
{
    match_t longest;

    while(pos) {
        if(pos->is_param()) {
            const auto& param = pos->as_param();
            if(select(param)) {
                auto match = param.match(arg);
                if(match.prefix()) {
                    if(match.length() == arg.size()) {
                        return match_t{arg, std::move(pos)};
                    }
                    else if(match.length() > longest.length()) {
                        longest = match_t{arg.substr(match.at(), match.length()), 
                                          pos};
                    }
                }
            }
        }
        ++pos;
    }
    return longest;
}